

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exp.h
# Opt level: O2

RegEx * YAML::Exp::Chomp(void)

{
  int iVar1;
  RegEx *pRVar2;
  RegEx *pRVar3;
  RegEx RStack_88;
  RegEx local_68;
  RegEx local_48;
  RegEx local_28;
  
  if (Chomp()::e == '\0') {
    iVar1 = __cxa_guard_acquire(&Chomp()::e);
    if (iVar1 != 0) {
      pRVar2 = ChompIndicator();
      pRVar3 = Digit();
      operator+(&local_68,pRVar2,pRVar3);
      pRVar2 = Digit();
      pRVar3 = ChompIndicator();
      operator+(&RStack_88,pRVar2,pRVar3);
      operator|(&local_48,&local_68,&RStack_88);
      pRVar2 = ChompIndicator();
      operator|(&local_28,&local_48,pRVar2);
      pRVar2 = Digit();
      operator|(&Chomp::e,&local_28,pRVar2);
      std::vector<YAML::RegEx,_std::allocator<YAML::RegEx>_>::~vector(&local_28.m_params);
      std::vector<YAML::RegEx,_std::allocator<YAML::RegEx>_>::~vector(&local_48.m_params);
      std::vector<YAML::RegEx,_std::allocator<YAML::RegEx>_>::~vector(&RStack_88.m_params);
      std::vector<YAML::RegEx,_std::allocator<YAML::RegEx>_>::~vector(&local_68.m_params);
      __cxa_atexit(RegEx::~RegEx,&Chomp::e,&__dso_handle);
      __cxa_guard_release(&Chomp()::e);
    }
  }
  return &Chomp::e;
}

Assistant:

inline const RegEx& Chomp() {
  static const RegEx e = (ChompIndicator() + Digit()) |
                         (Digit() + ChompIndicator()) | ChompIndicator() |
                         Digit();
  return e;
}